

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(ze_device_memory_properties_t val)

{
  ostream *poVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  string *in_RDI;
  ze_structure_type_t in_stack_00000008;
  ze_device_memory_property_flag_t in_stack_00000018;
  uint in_stack_0000001c;
  stringstream ss;
  ulong in_stack_00000028;
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1b8,in_stack_00000008);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1b8._0_8_);
  if ((ostream *)local_1b8._0_8_ != (ostream *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0x",2);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1b8,in_stack_00000018);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1b8._0_8_);
  if ((ostream *)local_1b8._0_8_ != poVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000001c) {
    uVar6 = in_stack_0000001c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00104ffb;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00104ffb;
      }
      if (uVar6 < 10000) goto LAB_00104ffb;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00104ffb:
  local_1b8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1b8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1b8._0_8_,local_1b8._8_4_,in_stack_0000001c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1b8._0_8_);
  if ((ostream *)local_1b8._0_8_ != poVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < _ss) {
    uVar6 = _ss;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001050b5;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001050b5;
      }
      if (uVar6 < 10000) goto LAB_001050b5;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001050b5:
  local_1b8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1b8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b8._0_8_,local_1b8._8_4_,_ss);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1b8._0_8_);
  if ((ostream *)local_1b8._0_8_ != poVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000028) {
    uVar5 = in_stack_00000028;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010517b;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010517b;
      }
      if (uVar5 < 10000) goto LAB_0010517b;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010517b:
  local_1b8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1b8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_1b8._0_8_,local_1b8._8_4_,in_stack_00000028);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1b8._0_8_);
  if ((ostream *)local_1b8._0_8_ != poVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string( const ze_device_memory_properties_t val )
{
    std::string str;
    
    str += "stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "flags : ";
    str += to_string((ze_device_memory_property_flag_t)val.flags);
    str += "\n";
    
    str += "maxClockRate : ";
    str += std::to_string(val.maxClockRate);
    str += "\n";
    
    str += "maxBusWidth : ";
    str += std::to_string(val.maxBusWidth);
    str += "\n";
    
    str += "totalSize : ";
    str += std::to_string(val.totalSize);
    str += "\n";
    
    str += "name : ";
    str += val.name;
    str += "\n";

    return str;
}